

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_id.cpp
# Opt level: O3

bool anon_unknown.dwarf_128b92::open_map
               (char *filename,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *cmap,Iconv *iconv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char cVar3;
  undefined1 uVar4;
  int iVar5;
  ostream *poVar6;
  size_t sVar7;
  istream *piVar8;
  char *pcVar9;
  ulong uVar10;
  char **ppcVar11;
  char *pcVar12;
  char *pcVar13;
  string line;
  string pos;
  char *col [2];
  ifstream ifs;
  char *local_2b0;
  long local_2a8;
  char local_2a0 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_290;
  string local_268;
  char *local_248 [2];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream((istream *)local_238,filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"no such file or directory: ",0x1b);
    if (filename == (char *)0x0) {
      std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
    }
    else {
      sVar7 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,filename,sVar7);
    }
    MeCab::die::~die((die *)&local_290);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear(&cmap->_M_t);
  local_2b0 = local_2a0;
  local_2a8 = 0;
  local_2a0[0] = '\0';
  paVar1 = &local_290.first.field_2;
  do {
    cVar3 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2b0,cVar3);
    pcVar13 = local_2b0;
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
      if (local_2b0 != local_2a0) {
        operator_delete(local_2b0);
      }
      uVar4 = std::ifstream::~ifstream(local_238);
      return (bool)uVar4;
    }
    sVar7 = strlen(local_2b0);
    pcVar9 = pcVar13 + sVar7;
    ppcVar11 = local_248;
    uVar10 = 0;
    do {
      pcVar2 = pcVar13;
      if (1 < uVar10) break;
      for (; ((pcVar12 = pcVar9, pcVar2 != pcVar9 && (pcVar12 = pcVar2, *pcVar2 != '\t')) &&
             (*pcVar2 != ' ')); pcVar2 = pcVar2 + 1) {
      }
      *pcVar12 = '\0';
      if (*pcVar13 != '\0') {
        *ppcVar11 = pcVar13;
        ppcVar11 = ppcVar11 + 1;
        uVar10 = uVar10 + 1;
      }
      pcVar13 = pcVar12 + 1;
    } while (pcVar12 != pcVar9);
    if (uVar10 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/context_id.cpp"
                 ,0x70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x19);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,"2 == tokenize2(const_cast<char *>(line.c_str()), \" \\t\", col, 2)",0x3f);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"format error: ",0xe);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_2b0,local_2a8);
      MeCab::die::~die((die *)&local_290);
    }
    std::__cxx11::string::string((string *)&local_268,local_248[1],(allocator *)&local_290);
    if (iconv != (Iconv *)0x0) {
      MeCab::Iconv::convert(iconv,&local_268);
    }
    iVar5 = atoi(local_248[0]);
    local_290.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_268._M_dataplus._M_p,
               local_268._M_dataplus._M_p + local_268._M_string_length);
    local_290.second = iVar5;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)cmap,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_290.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

bool open_map(const char *filename,
              std::map<std::string, int> *cmap,
              Iconv *iconv) {
  std::ifstream ifs(WPATH(filename));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;
  cmap->clear();
  char *col[2];
  std::string line;
  while (std::getline(ifs, line)) {
    CHECK_DIE(2 == tokenize2(const_cast<char *>(line.c_str()),
                             " \t", col, 2))
        << "format error: " << line;
    std::string pos = col[1];
    if (iconv) {
      iconv->convert(&pos);
    }
    cmap->insert(std::pair<std::string, int>
                 (pos, std::atoi(col[0])));
  }
  return true;
}